

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O1

int getQuadHutCst(uint64_t low20)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  
  uVar2 = 0x43f18;
  puVar1 = low20QuadIdeal;
  do {
    puVar1 = puVar1 + 1;
    if (uVar2 == low20) {
      return 1;
    }
    uVar2 = *puVar1;
  } while (uVar2 != 0);
  uVar2 = 0x43f18;
  puVar1 = low20QuadClassic;
  do {
    puVar1 = puVar1 + 1;
    if (uVar2 == low20) {
      return 2;
    }
    uVar2 = *puVar1;
  } while (uVar2 != 0);
  uVar2 = 0x43f18;
  puVar1 = low20QuadHutNormal;
  do {
    puVar1 = puVar1 + 1;
    if (uVar2 == low20) {
      return 3;
    }
    uVar2 = *puVar1;
  } while (uVar2 != 0);
  uVar2 = 0x1272d;
  puVar1 = low20QuadHutBarely;
  do {
    puVar1 = puVar1 + 1;
    if (uVar2 == low20) {
      return 4;
    }
    uVar2 = *puVar1;
  } while (uVar2 != 0);
  return 0;
}

Assistant:

int getQuadHutCst(uint64_t low20)
{
    const uint64_t *cst;
    for (cst = low20QuadIdeal; *cst; cst++)
        if (*cst == low20)
            return CST_IDEAL;
    for (cst = low20QuadClassic; *cst; cst++)
        if (*cst == low20)
            return CST_CLASSIC;
    for (cst = low20QuadHutNormal; *cst; cst++)
        if (*cst == low20)
            return CST_NORMAL;
    for (cst = low20QuadHutBarely; *cst; cst++)
        if (*cst == low20)
            return CST_BARELY;
    return CST_NONE;
}